

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::UTF16CollationIterator::nextCodePoint(UTF16CollationIterator *this,UErrorCode *param_1)

{
  UChar *pUVar1;
  UChar UVar2;
  UChar UVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar32 UVar6;
  
  pUVar4 = this->pos;
  pUVar5 = this->limit;
  UVar6 = -1;
  if (pUVar4 != pUVar5) {
    UVar2 = *pUVar4;
    if (pUVar5 == (UChar *)0x0 && UVar2 == L'\0') {
      this->limit = pUVar4;
      return UVar6;
    }
    pUVar1 = pUVar4 + 1;
    this->pos = pUVar1;
    if ((pUVar1 == pUVar5 || ((ushort)UVar2 & 0xfc00) != 0xd800) ||
       (UVar3 = *pUVar1, ((ushort)UVar3 & 0xfc00) != 0xdc00)) {
      return (uint)(ushort)UVar2;
    }
    this->pos = pUVar4 + 2;
    UVar6 = (uint)(ushort)UVar3 + (uint)(ushort)UVar2 * 0x400 + -0x35fdc00;
  }
  return UVar6;
}

Assistant:

UChar32
UTF16CollationIterator::nextCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == limit) {
        return U_SENTINEL;
    }
    UChar32 c = *pos;
    if(c == 0 && limit == NULL) {
        limit = pos;
        return U_SENTINEL;
    }
    ++pos;
    UChar trail;
    if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(trail = *pos)) {
        ++pos;
        return U16_GET_SUPPLEMENTARY(c, trail);
    } else {
        return c;
    }
}